

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

void Am_Set_Animated_Slots(Am_Object *interp)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value *pAVar4;
  Am_Constraint *constraint;
  Am_Object obj;
  Am_Value_List slots;
  Am_Value curr_value;
  Am_Value_List values;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Value local_48;
  Am_Value_List local_38;
  
  pAVar3 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value(&local_48,pAVar3);
  bVar1 = Am_Value::Exists(&local_48);
  if (bVar1) {
    Am_Object::Get_Object(&local_60,(Am_Slot_Key)interp,0x193);
    bVar1 = Am_Object::Valid(&local_60);
    if (bVar1) {
      pAVar3 = Am_Object::Get(interp,0xeb,0);
      pAVar4 = Am_Object::Get(interp,0xf6,0);
      constraint = (Am_Constraint *)Am_Value::operator_cast_to_void_(pAVar4);
      bVar1 = Am_Value_List::Test(pAVar3);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&local_58,pAVar3);
        bVar1 = Am_Value_List::Test(&local_48);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_38,&local_48);
          Am_Value_List::Start(&local_38);
          Am_Value_List::Start(&local_58);
          while( true ) {
            bVar1 = Am_Value_List::Last(&local_58);
            if (bVar1) break;
            bVar1 = Am_Value_List::Last(&local_38);
            if (bVar1) break;
            pAVar3 = Am_Value_List::Get(&local_58);
            iVar2 = Am_Value::operator_cast_to_int(pAVar3);
            pAVar3 = Am_Value_List::Get(&local_38);
            set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&local_60,constraint,pAVar3);
            Am_Value_List::Next(&local_38);
            Am_Value_List::Next(&local_58);
          }
          Am_Value_List::~Am_Value_List(&local_38);
        }
        else {
          pAVar3 = Am_Value_List::Get(&local_58);
          iVar2 = Am_Value::operator_cast_to_int(pAVar3);
          set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&local_60,constraint,&local_48)
          ;
        }
        Am_Value_List::~Am_Value_List(&local_58);
      }
      else {
        bVar1 = Am_Value_List::Test(&local_48);
        if (bVar1) {
          Am_Value_List::Am_Value_List(&local_58,&local_48);
          pAVar4 = Am_Value_List::Get(&local_58);
          Am_Value::operator=(&local_48,pAVar4);
          Am_Value_List::~Am_Value_List(&local_58);
        }
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        set_animated_slot((Am_Slot_Key)iVar2,(Am_Object_Advanced *)&local_60,constraint,&local_48);
      }
    }
    Am_Object::~Am_Object(&local_60);
  }
  Am_Value::~Am_Value(&local_48);
  return;
}

Assistant:

void
Am_Set_Animated_Slots(Am_Object interp)
{
  Am_Value curr_value = interp.Get(Am_VALUE);
  if (!curr_value.Exists())
    return;

  Am_Object obj = interp.Get_Object(Am_OPERATES_ON);
  if (!obj.Valid())
    return;

  // pass the computed value back to the animation constraint
  const Am_Value& slot_to_animate = interp.Get(Am_SLOT_TO_ANIMATE);
  Am_Constraint *constraint;

  constraint = (Am_Constraint *)(Am_Ptr)interp.Get(Am_ANIM_CONSTRAINT);

  //
  // Do we have a list of slots or just one?
  //
  if (Am_Value_List::Test(slot_to_animate)) {
    Am_Value_List slots = slot_to_animate;

    //
    // Do we have a list of values, or just one?
    //
    if (Am_Value_List::Test(curr_value)) {
      Am_Value_List values = curr_value;

      values.Start();

      //
      // Go through both lists, until one of them runs out, assigning
      // each slot the corresponding value.
      //
      for (slots.Start(); !slots.Last() && !values.Last(); slots.Next()) {
        set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj,
                          constraint, values.Get());
        values.Next();
      }
    } else {
      //
      // We've only got a single value, so assign it just to the
      // first slot.
      //
      set_animated_slot((int)slots.Get(), (Am_Object_Advanced &)obj, constraint,
                        curr_value);
    }
  }
  //
  // We come here if we only have a single slot.
  //
  else {
    //
    // If `curr_value' is really a list, then get its first value.
    //
    if (Am_Value_List::Test(curr_value))
      curr_value = ((Am_Value_List)curr_value).Get();

    //
    // We have just one slot so assign it the value.
    //
    set_animated_slot((int)slot_to_animate, (Am_Object_Advanced &)obj,
                      constraint, curr_value);
  }
}